

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O0

void mp::internal::SignalHandler::HandleSigInt(int sig)

{
  __int_type _Var1;
  __pointer_type pcVar2;
  ssize_t sVar3;
  __pointer_type p_Var4;
  __pointer_type pvVar5;
  int in_EDI;
  InterruptHandler handler;
  int result;
  uint count;
  undefined4 in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffdc;
  uint local_8;
  
  local_8 = 0;
  do {
    pcVar2 = std::atomic::operator_cast_to_char_((atomic<const_char_*> *)0x2bbf7c);
    _Var1 = std::__atomic_base::operator_cast_to_unsigned_int
                      ((__atomic_base<unsigned_int> *)
                       CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    sVar3 = write(1,pcVar2 + local_8,(ulong)(_Var1 - local_8));
    if ((int)sVar3 < 0) break;
    local_8 = (int)sVar3 + local_8;
    in_stack_ffffffffffffffdc = local_8;
    _Var1 = std::__atomic_base::operator_cast_to_unsigned_int
                      ((__atomic_base<unsigned_int> *)CONCAT44(local_8,in_stack_ffffffffffffffd8));
  } while (in_stack_ffffffffffffffdc < _Var1);
  if (stop_ < 2) {
    stop_ = stop_ + 1;
    p_Var4 = std::atomic::operator_cast_to_function_pointer((atomic<bool_(*)(void_*)> *)0x2bc01b);
    if (p_Var4 != (__pointer_type)0x0) {
      pvVar5 = std::atomic::operator_cast_to_void_((atomic<void_*> *)0x2bc03e);
      (*p_Var4)(pvVar5);
    }
    signal(in_EDI,HandleSigInt);
    return;
  }
  _exit(1);
}

Assistant:

void SignalHandler::HandleSigInt(int sig) {
  unsigned count = 0;
  do {
    // Use asynchronous-safe function write instead of printf!
    int result = MP_WRITE(1, signal_message_ptr_ + count,
        signal_message_size_ - count);
    if (result < 0) break;
    count += result;
  } while (count < signal_message_size_);
  if (stop_>1) {    // AMPL seems to send 2x SIGINT
    // Use asynchronous-safe function _exit instead of exit!
    _exit(1);
  }
  ++stop_;
  if (InterruptHandler handler = handler_)
    handler(data_);
  // Restore the handler since it might have been reset before the handler
  // is called (this is implementation defined).
  std::signal(sig, HandleSigInt);
}